

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockExpectedCallTest.cpp
# Opt level: O2

void __thiscall
TEST_MockExpectedCall_callWithObjectParameterEqualComparisonButFailsWithoutRepository_Test::testBody
          (TEST_MockExpectedCall_callWithObjectParameterEqualComparisonButFailsWithoutRepository_Test
           *this)

{
  MockCheckedExpectedCall *pMVar1;
  int iVar2;
  UtestShell *pUVar3;
  TestTerminator *pTVar4;
  SimpleString SStack_a8;
  SimpleString local_98;
  TypeForTestingExpectedFunctionCall equalType;
  TypeForTestingExpectedFunctionCall type;
  MockNamedValue parameter;
  
  TypeForTestingExpectedFunctionCall::TypeForTestingExpectedFunctionCall(&type,1);
  TypeForTestingExpectedFunctionCall::TypeForTestingExpectedFunctionCall(&equalType,1);
  SimpleString::SimpleString(&SStack_a8,"name");
  MockNamedValue::MockNamedValue(&parameter,&SStack_a8);
  SimpleString::~SimpleString(&SStack_a8);
  SimpleString::SimpleString(&SStack_a8,"type");
  MockNamedValue::setConstObjectPointer(&parameter,&SStack_a8,&equalType);
  SimpleString::~SimpleString(&SStack_a8);
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockExpectedCall).call;
  SimpleString::SimpleString(&SStack_a8,"type");
  SimpleString::SimpleString(&local_98,"name");
  (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[5])(pMVar1,&SStack_a8,&local_98,&type);
  SimpleString::~SimpleString(&local_98);
  SimpleString::~SimpleString(&SStack_a8);
  pUVar3 = UtestShell::getCurrent();
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockExpectedCall).call;
  iVar2 = (*(pMVar1->super_MockExpectedCall)._vptr_MockExpectedCall[0x2b])(pMVar1,&parameter);
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[8])
            (pUVar3,(ulong)(byte)((byte)iVar2 ^ 1),"CHECK","!call->hasInputParameter(parameter)",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
             ,0x167,pTVar4);
  MockNamedValue::~MockNamedValue(&parameter);
  TypeForTestingExpectedFunctionCall::~TypeForTestingExpectedFunctionCall(&equalType);
  TypeForTestingExpectedFunctionCall::~TypeForTestingExpectedFunctionCall(&type);
  return;
}

Assistant:

TEST(MockExpectedCall, callWithObjectParameterEqualComparisonButFailsWithoutRepository)
{
    TypeForTestingExpectedFunctionCall type(1), equalType(1);
    MockNamedValue parameter("name");
    parameter.setConstObjectPointer("type", &equalType);
    call->withParameterOfType("type", "name", &type);
    CHECK(!call->hasInputParameter(parameter));
}